

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall BRTS_XZ<UF>::SecondScan(BRTS_XZ<UF> *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  Run *pRVar9;
  Run *pRVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long local_68;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar12 = (long)*(int *)&pMVar4->field_0x8;
  if (0 < lVar12) {
    uVar2 = *(uint *)&pMVar4->field_0xc;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    pRVar10 = (this->data_runs).runs;
    lVar6 = *(long *)&pMVar5->field_0x10;
    lVar7 = **(long **)&pMVar5->field_0x48;
    lVar15 = 0;
    local_68 = lVar6;
    do {
      puVar8 = UF::P_;
      lVar13 = lVar7 * lVar15 + lVar6;
      uVar14 = 0;
      pRVar9 = pRVar10;
      do {
        pRVar10 = pRVar9;
        uVar16 = (uint)pRVar10->start_pos;
        if (pRVar10->start_pos == 0xffff) {
          if ((int)uVar14 < (int)uVar2) {
            memset((void *)(lVar13 + (long)(int)uVar14 * 4),0,(ulong)(~uVar14 + uVar2) * 4 + 4);
            uVar14 = uVar2;
          }
          pRVar10 = pRVar10 + 1;
        }
        else {
          uVar1 = pRVar10->end_pos;
          uVar3 = puVar8[pRVar10->label];
          if ((int)uVar14 < (int)uVar16) {
            memset((void *)(lVar13 + (long)(int)uVar14 * 4),0,(ulong)(~uVar14 + uVar16) * 4 + 4);
            lVar11 = 0;
            do {
              lVar11 = lVar11 + -1;
            } while ((long)(int)uVar14 - (ulong)uVar16 != lVar11);
            uVar14 = uVar14 - (int)lVar11;
          }
          if ((int)uVar14 < (int)(uint)uVar1) {
            lVar11 = 0;
            do {
              *(uint *)(local_68 + (long)(int)uVar14 * 4 + lVar11 * 4) = uVar3;
              lVar11 = lVar11 + 1;
            } while ((ulong)uVar1 - (long)(int)uVar14 != lVar11);
            uVar14 = uVar14 + (int)lVar11;
          }
        }
        pRVar9 = pRVar10 + 1;
      } while (uVar16 != 0xffff);
      lVar15 = lVar15 + 1;
      local_68 = local_68 + lVar7;
    } while (lVar15 != lVar12);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }
    }